

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Field::MergeFrom(Field *this,Message *from)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((Field *)from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/type.pb.cc"
               ,0x478);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((from->super_MessageLite)._vptr_MessageLite == (_func_int **)&PTR__Field_003c8788) {
    MergeFrom(this,(Field *)from);
  }
  else {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void Field::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.Field)
  GOOGLE_DCHECK_NE(&from, this);
  const Field* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<Field>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.Field)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.Field)
    MergeFrom(*source);
  }
}